

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

longdouble *
trng::math::detail::inv_Phi_approx<long_double>(longdouble *__return_storage_ptr__,longdouble x)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined8 in_RAX;
  longdouble *plVar3;
  
  lVar2 = (longdouble)0;
  plVar3 = (longdouble *)CONCAT71((int7)((ulong)in_RAX >> 8),lVar2 <= x);
  lVar1 = (longdouble)1;
  if (lVar2 <= x && x <= lVar1) {
    if ((x != lVar2) || (NAN(x) || NAN(lVar2))) {
      if ((x != lVar1) || (NAN(x) || NAN(lVar1))) {
        if (_DAT_002a97b0 <= x) {
          if (_DAT_002a97c0 <= x) {
            log1pl();
            plVar3 = (longdouble *)sqrtl();
          }
        }
        else {
          logl();
          plVar3 = (longdouble *)sqrtl();
        }
      }
    }
  }
  else {
    plVar3 = (longdouble *)__errno_location();
    *(int *)plVar3 = 0x21;
  }
  return plVar3;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Phi_approx(T x) {
        using traits = inv_Phi_traits<T>;
        if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        if (x == 0)
          return -numeric_limits<T>::infinity();
        if (x == 1)
          return numeric_limits<T>::infinity();
        if (x < traits::x_low) {
          // rational approximation for lower region
          const T q{sqrt(-2 * ln(x))};
          return (((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q + traits::c[3]) *
                       q +
                   traits::c[4]) *
                      q +
                  traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        } else if (x < traits::x_high) {
          // rational approximation for central region
          const T q{x - traits::one_half};
          const T r{q * q};
          return (((((traits::a[0] * r + traits::a[1]) * r + traits::a[2]) * r + traits::a[3]) *
                       r +
                   traits::a[4]) *
                      r +
                  traits::a[5]) *
                 q /
                 (((((traits::b[0] * r + traits::b[1]) * r + traits::b[2]) * r + traits::b[3]) *
                       r +
                   traits::b[4]) *
                      r +
                  1);
        } else {
          // rational approximation for upper region
          const T q{sqrt(-2 * ln1p(-x))};
          return -(((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q +
                     traits::c[3]) *
                        q +
                    traits::c[4]) *
                       q +
                   traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        }
      }